

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O3

uchar __thiscall
RegVmLoweredFunction::AllocateRegister
          (RegVmLoweredFunction *this,VmValue *value,uint index,bool freeDelayed)

{
  SmallArray<unsigned_char,_8U> *this_00;
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uchar uVar4;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    value = (VmValue *)0x0;
  }
  if (freeDelayed) {
    FreeDelayedRegisters(this,(RegVmLoweredBlock *)0x0);
  }
  if (value == (VmValue *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0xb1,
                  "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
                 );
  }
  if ((value->users).count == 0) {
    __assert_fail("!instruction->users.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0xb2,
                  "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
                 );
  }
  if (*(char *)(value[1].users.little + 1) == '\x01') {
    if (*(uint *)(value[1].users.little + 3) <= index) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<unsigned char, 8>::operator[](unsigned int) [T = unsigned char, N = 8]"
                   );
    }
  }
  else {
    if (*(uint *)(value[1].users.little + 3) != index) {
      __assert_fail("instruction->regVmRegisters.size() == index",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0xb7,
                    "unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *, unsigned int, bool)"
                   );
    }
    this_00 = (SmallArray<unsigned_char,_8U> *)(value[1].users.little + 2);
    uVar4 = GetRegister(this);
    uVar1 = *(uint *)(value[1].users.little + 3);
    if (uVar1 == *(uint *)((long)value[1].users.little + 0x1c)) {
      SmallArray<unsigned_char,_8U>::grow(this_00,uVar1);
    }
    puVar3 = this_00->data;
    if (puVar3 == (uchar *)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<unsigned char, 8>::push_back(const T &) [T = unsigned char, N = 8]"
                   );
    }
    uVar1 = *(uint *)(value[1].users.little + 3);
    *(uint *)(value[1].users.little + 3) = uVar1 + 1;
    puVar3[uVar1] = uVar4;
    iVar2 = *(int *)(value[1].users.little + 3);
    if (iVar2 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,"T &SmallArray<unsigned char, 8>::back() [T = unsigned char, N = 8]");
    }
    index = iVar2 - 1;
  }
  return *(uchar *)((long)(value[1].users.little[2]->users).little + ((ulong)index - 0x50));
}

Assistant:

unsigned char RegVmLoweredFunction::AllocateRegister(VmValue *value, unsigned index, bool freeDelayed)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	if(freeDelayed)
		FreeDelayedRegisters(NULL);

	assert(instruction);
	assert(!instruction->users.empty());

	if(instruction->regVmAllocated)
		return instruction->regVmRegisters[index];

	assert(instruction->regVmRegisters.size() == index);

	instruction->regVmRegisters.push_back(GetRegister());

	return instruction->regVmRegisters.back();
}